

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::createwalletdescriptor(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff0c8;
  allocator<RPCArg> *this;
  RPCArg *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0d0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff0d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff100;
  allocator<char> *in_stack_fffffffffffff108;
  iterator in_stack_fffffffffffff110;
  RPCArgOptions *in_stack_fffffffffffff118;
  string *in_stack_fffffffffffff120;
  undefined7 in_stack_fffffffffffff128;
  undefined1 in_stack_fffffffffffff12f;
  undefined4 in_stack_fffffffffffff130;
  Type in_stack_fffffffffffff134;
  string *in_stack_fffffffffffff138;
  undefined4 in_stack_fffffffffffff140;
  Type in_stack_fffffffffffff144;
  undefined4 in_stack_fffffffffffff148;
  Type in_stack_fffffffffffff14c;
  RPCArg *in_stack_fffffffffffff150;
  RPCArgOptions *in_stack_fffffffffffff170;
  undefined1 *local_e78;
  RPCMethodImpl *local_e60;
  undefined1 *local_e48;
  undefined1 *local_e30;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  undefined1 local_ca0 [35];
  allocator<char> local_c7d;
  allocator<char> local_c7c;
  allocator<char> local_c7b [3];
  RPCExamples local_c78;
  undefined1 local_c52;
  vector<RPCArg,_std::allocator<RPCArg>_> local_c51;
  undefined1 local_c32;
  undefined1 local_c31 [31];
  undefined1 local_c12 [28];
  allocator<char> local_bf6;
  allocator<char> local_bf5;
  allocator<char> local_bf4;
  allocator<char> local_bf3;
  allocator<char> local_bf2;
  allocator<char> local_bf1 [32];
  allocator<char> local_bd1;
  undefined4 local_bd0;
  allocator<char> local_bca;
  allocator<char> local_bc9;
  undefined1 local_bc8 [39];
  allocator<char> local_ba1 [321];
  undefined1 local_a60 [136];
  undefined1 local_9d8 [64];
  undefined1 local_998 [136];
  undefined1 local_910 [200];
  allocator<RPCArg> local_848 [40];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined1 local_808;
  undefined1 local_807;
  undefined1 local_800;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined1 local_7c0;
  undefined1 local_7bf;
  undefined1 local_6f8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined1 local_6b8;
  undefined1 local_6b7;
  undefined1 local_5f0 [528];
  undefined1 local_3e0 [160];
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  RPCMethodImpl local_258 [16];
  RPCMethodImpl local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::operator+(&in_stack_fffffffffffff118->skip_type_check,&in_stack_fffffffffffff110->m_names);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_bc8._0_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff0d8,(Optional *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff0e0);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff0c8);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
                 in_stack_fffffffffffff138,in_stack_fffffffffffff134,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff12f,in_stack_fffffffffffff128),
                 in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_bd0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff0d8,(Optional *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_6f8 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff0e0);
  local_6d0 = 0;
  uStack_6c8 = 0;
  local_6c0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff0c8);
  local_6b8 = 0;
  local_6b7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
                 in_stack_fffffffffffff138,in_stack_fffffffffffff134,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff12f,in_stack_fffffffffffff128),
                 in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_800 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff0e0);
  local_7d8 = 0;
  uStack_7d0 = 0;
  local_7c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff0c8);
  local_7c0 = 0;
  local_7bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
                 in_stack_fffffffffffff138,in_stack_fffffffffffff134,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff12f,in_stack_fffffffffffff128),
                 in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff0c8);
  __l._M_len = (size_type)in_stack_fffffffffffff118;
  __l._M_array = in_stack_fffffffffffff110;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff108,__l,
             (allocator_type *)in_stack_fffffffffffff100);
  local_848[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_fffffffffffff0e0);
  local_820 = 0;
  uStack_818 = 0;
  local_810 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff0c8);
  local_808 = 0;
  local_807 = 0;
  this = local_848;
  RPCArg::RPCArg(in_stack_fffffffffffff150,
                 (string *)CONCAT44(in_stack_fffffffffffff14c,in_stack_fffffffffffff148),
                 in_stack_fffffffffffff144,(Fallback *)in_stack_fffffffffffff138,
                 (string *)CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_fffffffffffff12f,in_stack_fffffffffffff128),
                 in_stack_fffffffffffff170);
  fun = local_258;
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len = (size_type)in_stack_fffffffffffff118;
  __l_00._M_array = in_stack_fffffffffffff110;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff108,__l_00,
             (allocator_type *)in_stack_fffffffffffff100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  this_01 = (RPCHelpMan *)local_c12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  name = (string *)local_c31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  description = (string *)&local_c32;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  args = &local_c51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  results = (RPCResults *)&local_c52;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_c78.m_examples._M_dataplus._M_p = (pointer)0x0;
  local_c78.m_examples._M_string_length = 0;
  local_c78.m_examples.field_2._M_allocated_capacity = 0;
  examples = &local_c78;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff150,in_stack_fffffffffffff14c,
             (string *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
             in_stack_fffffffffffff138,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
             (bool)in_stack_fffffffffffff12f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_01._M_len = (size_type)in_stack_fffffffffffff118;
  __l_01._M_array = (iterator)in_stack_fffffffffffff110;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff108,__l_01,
             (allocator_type *)in_stack_fffffffffffff100);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff150,in_stack_fffffffffffff14c,
             (string *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
             in_stack_fffffffffffff138,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
             (bool)in_stack_fffffffffffff12f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_02._M_len = (size_type)in_stack_fffffffffffff118;
  __l_02._M_array = (iterator)in_stack_fffffffffffff110;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff108,__l_02,
             (allocator_type *)in_stack_fffffffffffff100);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff150,in_stack_fffffffffffff14c,
             (string *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
             in_stack_fffffffffffff138,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
             (bool)in_stack_fffffffffffff12f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff14c,in_stack_fffffffffffff148),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  HelpExampleCli(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff118,(char *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  HelpExampleRpc(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  std::operator+(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x163745f);
  this_00 = (RPCArg *)local_ca0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::createwalletdescriptor()::__0,void>
            (in_stack_fffffffffffff0d8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff0d0);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_ca0 + 0x22));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_c7d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_c7c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_c7b);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_e30 = local_910;
  do {
    local_e30 = local_e30 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_e30 != local_998);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_e48 = local_9d8;
  do {
    local_e48 = local_e48 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_e48 != local_a60);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0d8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_c52);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_c51);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_c32);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_c31);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_c12);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_c12 + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff0d8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_e60 = local_48;
  do {
    local_e60 = (RPCMethodImpl *)&local_e60[-9]._M_invoker;
    RPCArg::~RPCArg(this_00);
  } while (local_e60 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff0d8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_e78 = local_3e0;
  do {
    local_e78 = local_e78 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_e78 != local_5f0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_bf6);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_bf5);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_bf4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_bf3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_bf2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_bf1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_bd1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_bca);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_bc9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_bc8 + 7));
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_ba1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan createwalletdescriptor()
{
    return RPCHelpMan{"createwalletdescriptor",
        "Creates the wallet's descriptor for the given address type. "
        "The address type must be one that the wallet does not already have a descriptor for."
        + HELP_REQUIRING_PASSPHRASE,
        {
            {"type", RPCArg::Type::STR, RPCArg::Optional::NO, "The address type the descriptor will produce. Options are \"legacy\", \"p2sh-segwit\", \"bech32\", and \"bech32m\"."},
            {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "", {
                {"internal", RPCArg::Type::BOOL, RPCArg::DefaultHint{"Both external and internal will be generated unless this parameter is specified"}, "Whether to only make one descriptor that is internal (if parameter is true) or external (if parameter is false)"},
                {"hdkey", RPCArg::Type::STR, RPCArg::DefaultHint{"The HD key used by all other active descriptors"}, "The HD key that the wallet knows the private key of, listed using 'gethdkeys', to use for this descriptor's key"},
            }},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::ARR, "descs", "The public descriptors that were added to the wallet",
                    {{RPCResult::Type::STR, "", ""}}
                }
            },
        },
        RPCExamples{
            HelpExampleCli("createwalletdescriptor", "bech32m")
            + HelpExampleRpc("createwalletdescriptor", "bech32m")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
            if (!pwallet) return UniValue::VNULL;

            //  Make sure wallet is a descriptor wallet
            if (!pwallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                throw JSONRPCError(RPC_WALLET_ERROR, "createwalletdescriptor is not available for non-descriptor wallets");
            }

            std::optional<OutputType> output_type = ParseOutputType(request.params[0].get_str());
            if (!output_type) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Unknown address type '%s'", request.params[0].get_str()));
            }

            UniValue options{request.params[1].isNull() ? UniValue::VOBJ : request.params[1]};
            UniValue internal_only{options["internal"]};
            UniValue hdkey{options["hdkey"]};

            std::vector<bool> internals;
            if (internal_only.isNull()) {
                internals.push_back(false);
                internals.push_back(true);
            } else {
                internals.push_back(internal_only.get_bool());
            }

            LOCK(pwallet->cs_wallet);
            EnsureWalletIsUnlocked(*pwallet);

            CExtPubKey xpub;
            if (hdkey.isNull()) {
                std::set<CExtPubKey> active_xpubs = pwallet->GetActiveHDPubKeys();
                if (active_xpubs.size() != 1) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Unable to determine which HD key to use from active descriptors. Please specify with 'hdkey'");
                }
                xpub = *active_xpubs.begin();
            } else {
                xpub = DecodeExtPubKey(hdkey.get_str());
                if (!xpub.pubkey.IsValid()) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Unable to parse HD key. Please provide a valid xpub");
                }
            }

            std::optional<CKey> key = pwallet->GetKey(xpub.pubkey.GetID());
            if (!key) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Private key for %s is not known", EncodeExtPubKey(xpub)));
            }
            CExtKey active_hdkey(xpub, *key);

            std::vector<std::reference_wrapper<DescriptorScriptPubKeyMan>> spkms;
            WalletBatch batch{pwallet->GetDatabase()};
            for (bool internal : internals) {
                WalletDescriptor w_desc = GenerateWalletDescriptor(xpub, *output_type, internal);
                uint256 w_id = DescriptorID(*w_desc.descriptor);
                if (!pwallet->GetScriptPubKeyMan(w_id)) {
                    spkms.emplace_back(pwallet->SetupDescriptorScriptPubKeyMan(batch, active_hdkey, *output_type, internal));
                }
            }
            if (spkms.empty()) {
                throw JSONRPCError(RPC_WALLET_ERROR, "Descriptor already exists");
            }

            // Fetch each descspkm from the wallet in order to get the descriptor strings
            UniValue descs{UniValue::VARR};
            for (const auto& spkm : spkms) {
                std::string desc_str;
                bool ok = spkm.get().GetDescriptorString(desc_str, false);
                CHECK_NONFATAL(ok);
                descs.push_back(desc_str);
            }
            UniValue out{UniValue::VOBJ};
            out.pushKV("descs", std::move(descs));
            return out;
        }
    };
}